

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O0

void __thiscall zmq::pipe_t::process_delimiter(pipe_t *this)

{
  long in_RDI;
  bool bVar1;
  pipe_t *in_stack_00000040;
  object_t *in_stack_00000048;
  
  bVar1 = true;
  if (*(int *)(in_RDI + 0x98) != 0) {
    bVar1 = *(int *)(in_RDI + 0x98) == 2;
  }
  if (!bVar1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "_state == active || _state == waiting_for_delimiter",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/pipe.cpp"
            ,0x1f8);
    fflush(_stderr);
    zmq_abort((char *)0x2c197d);
  }
  if (*(int *)(in_RDI + 0x98) == 0) {
    *(undefined4 *)(in_RDI + 0x98) = 1;
  }
  else {
    rollback(in_stack_00000040);
    *(undefined8 *)(in_RDI + 0x50) = 0;
    object_t::send_pipe_term_ack(in_stack_00000048,in_stack_00000040);
    *(undefined4 *)(in_RDI + 0x98) = 3;
  }
  return;
}

Assistant:

void zmq::pipe_t::process_delimiter ()
{
    zmq_assert (_state == active || _state == waiting_for_delimiter);

    if (_state == active)
        _state = delimiter_received;
    else {
        rollback ();
        _out_pipe = NULL;
        send_pipe_term_ack (_peer);
        _state = term_ack_sent;
    }
}